

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O3

void __thiscall ElfSegment::writeData(ElfSegment *this,ByteArray *output)

{
  Elf32_Off *pEVar1;
  Elf32_Off EVar2;
  Elf32_Addr EVar3;
  pointer ppEVar4;
  uint uVar5;
  size_t alignment;
  ulong uVar6;
  
  ppEVar4 = (this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if ((this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar4) {
    uVar5 = ((*ppEVar4)->header).sh_addralign;
    alignment = 0x10;
    if (0x10 < (int)uVar5) {
      alignment = (size_t)uVar5;
    }
    ByteArray::alignSize(output,alignment);
    EVar2 = (Elf32_Off)output->size_;
    (this->header).p_offset = EVar2;
    ppEVar4 = (this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar5 = (uint)((ulong)((long)(this->sections).
                                 super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar4) >> 3);
    if (0 < (int)uVar5) {
      uVar6 = 0;
      do {
        pEVar1 = &(ppEVar4[uVar6]->header).sh_offset;
        *pEVar1 = *pEVar1 + EVar2;
        uVar6 = uVar6 + 1;
      } while ((uVar5 & 0x7fffffff) != uVar6);
    }
    if (this->paddrSection != (ElfSection *)0x0) {
      (this->header).p_paddr = (this->paddrSection->header).sh_offset;
    }
    ByteArray::append(output,&this->data);
    return;
  }
  ByteArray::alignSize(output,(ulong)(this->header).p_align);
  EVar3 = (Elf32_Addr)output->size_;
  if ((this->header).p_offset == (this->header).p_paddr) {
    (this->header).p_paddr = EVar3;
  }
  (this->header).p_offset = EVar3;
  return;
}

Assistant:

void ElfSegment::writeData(ByteArray& output)
{
	if (sections.size() == 0)
	{
		output.alignSize(header.p_align);
		if (header.p_offset == header.p_paddr)
			header.p_paddr = (Elf32_Addr) output.size();

		header.p_offset = (Elf32_Off) output.size();
		return;
	}

	// align segment to alignment of first section
	int align = std::max<int>(sections[0]->getAlignment(),16);
	output.alignSize(align);

	header.p_offset = (Elf32_Off) output.size();
	for (int i = 0; i < (int)sections.size(); i++)
	{
		sections[i]->setOffsetBase(header.p_offset);
	}

	if (paddrSection)
	{
		header.p_paddr = paddrSection->getOffset();
	}

	output.append(data);
}